

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall ncnn::LSTM::load_model(LSTM *this,ModelBin *mb)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  long *in_RSI;
  long in_RDI;
  bool bVar4;
  int size;
  int num_directions;
  void *local_4f0;
  int *local_4e8;
  long *local_4d0;
  void *local_4a8;
  int *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long *local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined8 local_468;
  void *local_460;
  int *local_458;
  undefined8 local_450;
  undefined4 local_448;
  long *local_440;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined8 local_420;
  void *local_418;
  int *local_410;
  undefined8 local_408;
  undefined4 local_400;
  long *local_3f8;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  void *local_3d0;
  int *local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long *local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  void *local_378;
  int *local_370;
  undefined8 local_368;
  undefined4 local_360;
  long *local_358;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined8 local_338;
  undefined4 local_330;
  int local_32c;
  long *local_328;
  int local_314;
  void **local_310;
  void **local_300;
  void **local_2f0;
  void **local_2e0;
  void **local_2d0;
  void **local_2c0;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  void **local_2a0;
  void **local_298;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  void **local_280;
  void **local_278;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  void **local_260;
  void **local_258;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  void **local_240;
  void **local_238;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  void **local_220;
  void **local_218;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  void **local_200;
  void **local_1f8;
  long *local_1f0;
  long *local_1e8;
  long *local_1e0;
  long *local_1d8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_32c = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_32c = 2;
  }
  uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)local_32c;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xdc);
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4;
  local_330 = (undefined4)uVar2;
  local_328 = in_RSI;
  (**(code **)(*in_RSI + 0x20))
            (&local_378,in_RSI,uVar2 & 0xffffffff,*(int *)(in_RDI + 0xdc) << 2,local_32c,0);
  ppvVar3 = (void **)(in_RDI + 0x130);
  local_208 = &local_378;
  local_200 = ppvVar3;
  if (ppvVar3 != local_208) {
    if (local_370 != (int *)0x0) {
      local_20c = 1;
      LOCK();
      local_210 = *local_370;
      *local_370 = *local_370 + 1;
      UNLOCK();
    }
    local_1c8 = ppvVar3;
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar1 = *(int **)(in_RDI + 0x138);
      local_1cc = 0xffffffff;
      LOCK();
      local_1d0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_1d0 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          local_28 = *ppvVar3;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *ppvVar3 = *local_208;
    *(void **)(in_RDI + 0x138) = local_208[1];
    *(void **)(in_RDI + 0x140) = local_208[2];
    *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_208 + 3);
    *(void **)(in_RDI + 0x150) = local_208[4];
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_208 + 5);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_208 + 0x2c);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_208 + 6);
    *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_208 + 0x34);
    *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_208 + 7);
    *(void **)(in_RDI + 0x170) = local_208[8];
  }
  local_310 = &local_378;
  local_1f8 = ppvVar3;
  local_b8 = local_310;
  if (local_370 != (int *)0x0) {
    local_bc = 0xffffffff;
    LOCK();
    local_c0 = *local_370;
    *local_370 = *local_370 + -1;
    UNLOCK();
    if (local_c0 == 1) {
      if (local_358 == (long *)0x0) {
        if (local_378 != (void *)0x0) {
          free(local_378);
        }
      }
      else {
        (**(code **)(*local_358 + 0x18))(local_358,local_378);
      }
    }
  }
  local_378 = (void *)0x0;
  local_368 = 0;
  local_360 = 0;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_344 = 0;
  local_340 = 0;
  local_338 = 0;
  local_370 = (int *)0x0;
  local_1d8 = (long *)(in_RDI + 0x130);
  bVar4 = true;
  if (*local_1d8 != 0) {
    bVar4 = *(long *)(in_RDI + 0x170) * (long)*(int *)(in_RDI + 0x168) == 0;
    local_20 = local_1d8;
  }
  if (bVar4) {
    local_314 = -100;
  }
  else {
    (**(code **)(*local_328 + 0x20))
              (&local_3d0,local_328,*(undefined4 *)(in_RDI + 0xdc),4,local_32c,0);
    ppvVar3 = (void **)(in_RDI + 0x178);
    local_228 = &local_3d0;
    local_220 = ppvVar3;
    if (ppvVar3 != local_228) {
      if (local_3c8 != (int *)0x0) {
        local_22c = 1;
        LOCK();
        local_230 = *local_3c8;
        *local_3c8 = *local_3c8 + 1;
        UNLOCK();
      }
      local_1b8 = ppvVar3;
      if (*(long *)(in_RDI + 0x180) != 0) {
        piVar1 = *(int **)(in_RDI + 0x180);
        local_1bc = 0xffffffff;
        LOCK();
        local_1c0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_1c0 == 1) {
          if (*(long *)(in_RDI + 0x198) == 0) {
            local_30 = *ppvVar3;
            if (local_30 != (void *)0x0) {
              free(local_30);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined4 *)(in_RDI + 0x1ac) = 0;
      *(undefined4 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x1b8) = 0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      *ppvVar3 = *local_228;
      *(void **)(in_RDI + 0x180) = local_228[1];
      *(void **)(in_RDI + 0x188) = local_228[2];
      *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_228 + 3);
      *(void **)(in_RDI + 0x198) = local_228[4];
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_228 + 5);
      *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_228 + 0x2c);
      *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_228 + 6);
      *(undefined4 *)(in_RDI + 0x1ac) = *(undefined4 *)((long)local_228 + 0x34);
      *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(local_228 + 7);
      *(void **)(in_RDI + 0x1b8) = local_228[8];
    }
    local_300 = &local_3d0;
    local_218 = ppvVar3;
    local_d8 = local_300;
    if (local_3c8 != (int *)0x0) {
      local_dc = 0xffffffff;
      LOCK();
      local_e0 = *local_3c8;
      *local_3c8 = *local_3c8 + -1;
      UNLOCK();
      if (local_e0 == 1) {
        if (local_3b0 == (long *)0x0) {
          if (local_3d0 != (void *)0x0) {
            free(local_3d0);
          }
        }
        else {
          (**(code **)(*local_3b0 + 0x18))(local_3b0,local_3d0);
        }
      }
    }
    local_3d0 = (void *)0x0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3a8 = 0;
    local_3a4 = 0;
    local_3a0 = 0;
    local_39c = 0;
    local_398 = 0;
    local_390 = 0;
    local_3c8 = (int *)0x0;
    local_1e0 = (long *)(in_RDI + 0x178);
    bVar4 = true;
    if (*local_1e0 != 0) {
      bVar4 = *(long *)(in_RDI + 0x1b8) * (long)*(int *)(in_RDI + 0x1b0) == 0;
      local_18 = local_1e0;
    }
    if (bVar4) {
      local_314 = -100;
    }
    else {
      (**(code **)(*local_328 + 0x20))
                (&local_418,local_328,*(undefined4 *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xdc) << 2,
                 local_32c,0);
      ppvVar3 = (void **)(in_RDI + 0xe8);
      local_248 = &local_418;
      local_240 = ppvVar3;
      if (ppvVar3 != local_248) {
        if (local_410 != (int *)0x0) {
          local_24c = 1;
          LOCK();
          local_250 = *local_410;
          *local_410 = *local_410 + 1;
          UNLOCK();
        }
        local_1a8 = ppvVar3;
        if (*(long *)(in_RDI + 0xf0) != 0) {
          piVar1 = *(int **)(in_RDI + 0xf0);
          local_1ac = 0xffffffff;
          LOCK();
          local_1b0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1b0 == 1) {
            if (*(long *)(in_RDI + 0x108) == 0) {
              local_38 = *ppvVar3;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*ppvVar3)
              ;
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0xf8) = 0;
        *(undefined4 *)(in_RDI + 0x100) = 0;
        *(undefined4 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        *(undefined4 *)(in_RDI + 0x118) = 0;
        *(undefined4 *)(in_RDI + 0x11c) = 0;
        *(undefined4 *)(in_RDI + 0x120) = 0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *(undefined8 *)(in_RDI + 0xf0) = 0;
        *ppvVar3 = *local_248;
        *(void **)(in_RDI + 0xf0) = local_248[1];
        *(void **)(in_RDI + 0xf8) = local_248[2];
        *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_248 + 3);
        *(void **)(in_RDI + 0x108) = local_248[4];
        *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_248 + 5);
        *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_248 + 0x2c);
        *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_248 + 6);
        *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_248 + 0x34);
        *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_248 + 7);
        *(void **)(in_RDI + 0x128) = local_248[8];
      }
      local_2f0 = &local_418;
      local_238 = ppvVar3;
      local_f8 = local_2f0;
      if (local_410 != (int *)0x0) {
        local_fc = 0xffffffff;
        LOCK();
        local_100 = *local_410;
        *local_410 = *local_410 + -1;
        UNLOCK();
        if (local_100 == 1) {
          if (local_3f8 == (long *)0x0) {
            if (local_418 != (void *)0x0) {
              free(local_418);
            }
          }
          else {
            (**(code **)(*local_3f8 + 0x18))(local_3f8,local_418);
          }
        }
      }
      local_418 = (void *)0x0;
      local_408 = 0;
      local_400 = 0;
      local_3f0 = 0;
      local_3ec = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3d8 = 0;
      local_410 = (int *)0x0;
      local_1e8 = (long *)(in_RDI + 0xe8);
      bVar4 = true;
      if (*local_1e8 != 0) {
        bVar4 = *(long *)(in_RDI + 0x128) * (long)*(int *)(in_RDI + 0x120) == 0;
        local_10 = local_1e8;
      }
      if (bVar4) {
        local_314 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) != *(int *)(in_RDI + 0xdc)) {
          (**(code **)(*local_328 + 0x20))
                    (&local_460,local_328,*(undefined4 *)(in_RDI + 0xdc),
                     *(undefined4 *)(in_RDI + 0xd0),local_32c,0);
          ppvVar3 = (void **)(in_RDI + 0x1c0);
          local_268 = &local_460;
          local_260 = ppvVar3;
          if (ppvVar3 != local_268) {
            if (local_458 != (int *)0x0) {
              local_26c = 1;
              LOCK();
              local_270 = *local_458;
              *local_458 = *local_458 + 1;
              UNLOCK();
            }
            local_198 = ppvVar3;
            if (*(long *)(in_RDI + 0x1c8) != 0) {
              piVar1 = *(int **)(in_RDI + 0x1c8);
              local_19c = 0xffffffff;
              LOCK();
              local_1a0 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_1a0 == 1) {
                if (*(long *)(in_RDI + 0x1e0) == 0) {
                  local_40 = *ppvVar3;
                  if (local_40 != (void *)0x0) {
                    free(local_40);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x1e0) + 0x18))
                            (*(long **)(in_RDI + 0x1e0),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x1d0) = 0;
            *(undefined4 *)(in_RDI + 0x1d8) = 0;
            *(undefined4 *)(in_RDI + 0x1e8) = 0;
            *(undefined4 *)(in_RDI + 0x1ec) = 0;
            *(undefined4 *)(in_RDI + 0x1f0) = 0;
            *(undefined4 *)(in_RDI + 500) = 0;
            *(undefined4 *)(in_RDI + 0x1f8) = 0;
            *(undefined8 *)(in_RDI + 0x200) = 0;
            *(undefined8 *)(in_RDI + 0x1c8) = 0;
            *ppvVar3 = *local_268;
            *(void **)(in_RDI + 0x1c8) = local_268[1];
            *(void **)(in_RDI + 0x1d0) = local_268[2];
            *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_268 + 3);
            *(void **)(in_RDI + 0x1e0) = local_268[4];
            *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_268 + 5);
            *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_268 + 0x2c);
            *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_268 + 6);
            *(undefined4 *)(in_RDI + 500) = *(undefined4 *)((long)local_268 + 0x34);
            *(undefined4 *)(in_RDI + 0x1f8) = *(undefined4 *)(local_268 + 7);
            *(void **)(in_RDI + 0x200) = local_268[8];
          }
          local_2e0 = &local_460;
          local_258 = ppvVar3;
          local_118 = local_2e0;
          if (local_458 != (int *)0x0) {
            local_11c = 0xffffffff;
            LOCK();
            local_120 = *local_458;
            *local_458 = *local_458 + -1;
            UNLOCK();
            if (local_120 == 1) {
              if (local_440 == (long *)0x0) {
                if (local_460 != (void *)0x0) {
                  free(local_460);
                }
              }
              else {
                (**(code **)(*local_440 + 0x18))(local_440,local_460);
              }
            }
          }
          local_460 = (void *)0x0;
          local_450 = 0;
          local_448 = 0;
          local_438 = 0;
          local_434 = 0;
          local_430 = 0;
          local_42c = 0;
          local_428 = 0;
          local_420 = 0;
          local_458 = (int *)0x0;
          local_1f0 = (long *)(in_RDI + 0x1c0);
          bVar4 = true;
          if (*local_1f0 != 0) {
            bVar4 = *(long *)(in_RDI + 0x200) * (long)*(int *)(in_RDI + 0x1f8) == 0;
            local_8 = local_1f0;
          }
          if (bVar4) {
            return -100;
          }
        }
        if (*(int *)(in_RDI + 0xe0) != 0) {
          (**(code **)(*local_328 + 0x18))
                    (&local_4a8,local_328,*(int *)(in_RDI + 0xdc) << 2,local_32c,1);
          ppvVar3 = (void **)(in_RDI + 0x250);
          local_288 = &local_4a8;
          local_280 = ppvVar3;
          if (ppvVar3 != local_288) {
            if (local_4a0 != (int *)0x0) {
              local_28c = 1;
              LOCK();
              local_290 = *local_4a0;
              *local_4a0 = *local_4a0 + 1;
              UNLOCK();
            }
            local_188 = ppvVar3;
            if (*(long *)(in_RDI + 600) != 0) {
              piVar1 = *(int **)(in_RDI + 600);
              local_18c = 0xffffffff;
              LOCK();
              local_190 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_190 == 1) {
                if (*(long *)(in_RDI + 0x270) == 0) {
                  local_48 = *ppvVar3;
                  if (local_48 != (void *)0x0) {
                    free(local_48);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x270) + 0x18))
                            (*(long **)(in_RDI + 0x270),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x260) = 0;
            *(undefined4 *)(in_RDI + 0x268) = 0;
            *(undefined4 *)(in_RDI + 0x278) = 0;
            *(undefined4 *)(in_RDI + 0x27c) = 0;
            *(undefined4 *)(in_RDI + 0x280) = 0;
            *(undefined4 *)(in_RDI + 0x284) = 0;
            *(undefined4 *)(in_RDI + 0x288) = 0;
            *(undefined8 *)(in_RDI + 0x290) = 0;
            *(undefined8 *)(in_RDI + 600) = 0;
            *ppvVar3 = *local_288;
            *(void **)(in_RDI + 600) = local_288[1];
            *(void **)(in_RDI + 0x260) = local_288[2];
            *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_288 + 3);
            *(void **)(in_RDI + 0x270) = local_288[4];
            *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_288 + 5);
            *(undefined4 *)(in_RDI + 0x27c) = *(undefined4 *)((long)local_288 + 0x2c);
            *(undefined4 *)(in_RDI + 0x280) = *(undefined4 *)(local_288 + 6);
            *(undefined4 *)(in_RDI + 0x284) = *(undefined4 *)((long)local_288 + 0x34);
            *(undefined4 *)(in_RDI + 0x288) = *(undefined4 *)(local_288 + 7);
            *(void **)(in_RDI + 0x290) = local_288[8];
          }
          local_2d0 = &local_4a8;
          local_278 = ppvVar3;
          local_138 = local_2d0;
          if (local_4a0 != (int *)0x0) {
            local_13c = 0xffffffff;
            LOCK();
            local_140 = *local_4a0;
            *local_4a0 = *local_4a0 + -1;
            UNLOCK();
            if (local_140 == 1) {
              if (local_488 == (long *)0x0) {
                if (local_4a8 != (void *)0x0) {
                  free(local_4a8);
                }
              }
              else {
                (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
              }
            }
          }
          local_4a8 = (void *)0x0;
          local_498 = 0;
          local_490 = 0;
          local_480 = 0;
          local_47c = 0;
          local_478 = 0;
          local_474 = 0;
          local_470 = 0;
          local_468 = 0;
          local_4a0 = (int *)0x0;
          (**(code **)(*local_328 + 0x18))
                    (&local_4f0,local_328,*(int *)(in_RDI + 0xdc) << 2,local_32c,1);
          ppvVar3 = (void **)(in_RDI + 0x208);
          local_2a8 = &local_4f0;
          local_2a0 = ppvVar3;
          if (ppvVar3 != local_2a8) {
            if (local_4e8 != (int *)0x0) {
              local_2ac = 1;
              LOCK();
              local_2b0 = *local_4e8;
              *local_4e8 = *local_4e8 + 1;
              UNLOCK();
            }
            local_178 = ppvVar3;
            if (*(long *)(in_RDI + 0x210) != 0) {
              piVar1 = *(int **)(in_RDI + 0x210);
              local_17c = 0xffffffff;
              LOCK();
              local_180 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_180 == 1) {
                if (*(long *)(in_RDI + 0x228) == 0) {
                  local_50 = *ppvVar3;
                  if (local_50 != (void *)0x0) {
                    free(local_50);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x228) + 0x18))
                            (*(long **)(in_RDI + 0x228),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x218) = 0;
            *(undefined4 *)(in_RDI + 0x220) = 0;
            *(undefined4 *)(in_RDI + 0x230) = 0;
            *(undefined4 *)(in_RDI + 0x234) = 0;
            *(undefined4 *)(in_RDI + 0x238) = 0;
            *(undefined4 *)(in_RDI + 0x23c) = 0;
            *(undefined4 *)(in_RDI + 0x240) = 0;
            *(undefined8 *)(in_RDI + 0x248) = 0;
            *(undefined8 *)(in_RDI + 0x210) = 0;
            *ppvVar3 = *local_2a8;
            *(void **)(in_RDI + 0x210) = local_2a8[1];
            *(void **)(in_RDI + 0x218) = local_2a8[2];
            *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_2a8 + 3);
            *(void **)(in_RDI + 0x228) = local_2a8[4];
            *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_2a8 + 5);
            *(undefined4 *)(in_RDI + 0x234) = *(undefined4 *)((long)local_2a8 + 0x2c);
            *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_2a8 + 6);
            *(undefined4 *)(in_RDI + 0x23c) = *(undefined4 *)((long)local_2a8 + 0x34);
            *(undefined4 *)(in_RDI + 0x240) = *(undefined4 *)(local_2a8 + 7);
            *(void **)(in_RDI + 0x248) = local_2a8[8];
          }
          local_2c0 = &local_4f0;
          if (local_4e8 != (int *)0x0) {
            local_15c = 0xffffffff;
            LOCK();
            local_160 = *local_4e8;
            *local_4e8 = *local_4e8 + -1;
            UNLOCK();
            if (local_160 == 1) {
              local_298 = ppvVar3;
              local_158 = local_2c0;
              if (local_4d0 == (long *)0x0) {
                if (local_4f0 != (void *)0x0) {
                  free(local_4f0);
                }
              }
              else {
                (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
              }
            }
          }
        }
        local_314 = 0;
      }
    }
  }
  return local_314;
}

Assistant:

int LSTM::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / hidden_size / 4;

    // raw weight data
    weight_xc_data = mb.load(size, hidden_size * 4, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(hidden_size, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, hidden_size * 4, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    if (num_output != hidden_size)
    {
        weight_hr_data = mb.load(hidden_size, num_output, num_directions, 0);
        if (weight_hr_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_xc_data_int8_scales = mb.load(hidden_size * 4, num_directions, 1);
        weight_hc_data_int8_scales = mb.load(hidden_size * 4, num_directions, 1);
    }
#endif // NCNN_INT8

    return 0;
}